

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O1

void prvTidyBQ2Div(TidyDocImpl *doc,Node *node)

{
  Node *node_00;
  uint uVar1;
  tmbchar indent_buf [32];
  tmbchar atStack_48 [32];
  
  if (node != (Node *)0x0) {
    do {
      if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_BLOCKQUOTE)) ||
         (node->implicit == no)) {
        if (node->content != (Node *)0x0) {
          prvTidyBQ2Div(doc,node->content);
        }
      }
      else {
        uVar1 = 2;
        while (((node_00 = node->content, node_00 != (Node *)0x0 && (node_00->next == (Node *)0x0))
               && ((node_00->tag != (Dict *)0x0 &&
                   ((node_00->tag->id == TidyTag_BLOCKQUOTE && (node->implicit != no))))))) {
          StripOnlyChild(doc,node);
          uVar1 = uVar1 + 2;
        }
        if (node_00 != (Node *)0x0) {
          prvTidyBQ2Div(doc,node_00);
        }
        prvTidytmbsnprintf(atStack_48,0x20,"margin-left: %dem",(ulong)uVar1);
        RenameElem(doc,node,TidyTag_DIV);
        prvTidyAddStyleProperty(doc,node,atStack_48);
      }
      node = node->next;
    } while (node != (Node *)0x0);
  }
  return;
}

Assistant:

void TY_(BQ2Div)( TidyDocImpl* doc, Node *node )
{
    tmbchar indent_buf[ 32 ];
    uint indent;

    while (node)
    {
        if ( nodeIsBLOCKQUOTE(node) && node->implicit )
        {
            indent = 1;

            while( HasOneChild(node) &&
                   nodeIsBLOCKQUOTE(node->content) &&
                   node->implicit)
            {
                ++indent;
                StripOnlyChild( doc, node );
            }

            if (node->content)
                TY_(BQ2Div)( doc, node->content );

            TY_(tmbsnprintf)(indent_buf, sizeof(indent_buf), "margin-left: %dem",
                             2*indent);

            RenameElem( doc, node, TidyTag_DIV );
            TY_(AddStyleProperty)(doc, node, indent_buf );
        }
        else if (node->content)
            TY_(BQ2Div)( doc, node->content );

        node = node->next;
    }
}